

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

void __thiscall t_st_generator::generate_recv_method(t_st_generator *this,t_function *function)

{
  t_program *program;
  bool bVar1;
  int32_t key;
  string *psVar2;
  t_type *ptVar3;
  t_struct *this_00;
  t_field *this_01;
  reference pptVar4;
  ostream *poVar5;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  string local_2c8;
  undefined1 local_2a2;
  allocator local_2a1;
  string local_2a0;
  t_field *local_280;
  t_field *exception;
  t_field **local_270;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_268
  ;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *xs;
  string local_248;
  undefined1 local_228 [8];
  t_field success;
  string local_170;
  undefined1 local_150 [8];
  t_struct result;
  string signature;
  string local_58;
  undefined1 local_38 [8];
  string funname;
  t_function *function_local;
  t_st_generator *this_local;
  
  funname.field_2._8_8_ = function;
  psVar2 = t_function::get_name_abi_cxx11_(function);
  std::__cxx11::string::string((string *)&local_58,(string *)psVar2);
  t_generator::camelcase((string *)local_38,(t_generator *)this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  function_signature_abi_cxx11_((string *)&result.xsd_all_,this,(t_function *)funname.field_2._8_8_)
  ;
  program = (this->super_t_oop_generator).super_t_generator.program_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"TResult",(allocator *)&success.field_0xaf);
  t_struct::t_struct((t_struct *)local_150,program,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)&success.field_0xaf);
  ptVar3 = t_function::get_returntype((t_function *)funname.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"success",(allocator *)((long)&xs + 7));
  t_field::t_field((t_field *)local_228,ptVar3,&local_248,0);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)((long)&xs + 7));
  t_struct::append((t_struct *)local_150,(t_field *)local_228);
  this_00 = t_function::get_xceptions((t_function *)funname.field_2._8_8_);
  f_iter._M_current = (t_field **)t_struct::get_members(this_00);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_268);
  local_270 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_268._M_current = local_270;
  while( true ) {
    exception = (t_field *)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                          ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar1 = __gnu_cxx::operator!=
                      (&local_268,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&exception);
    if (!bVar1) break;
    this_01 = (t_field *)operator_new(0xb0);
    local_2a2 = 1;
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_268);
    ptVar3 = t_field::get_type(*pptVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a0,"exception",&local_2a1);
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_268);
    key = t_field::get_key(*pptVar4);
    t_field::t_field(this_01,ptVar3,&local_2a0,key);
    local_2a2 = 0;
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    local_280 = this_01;
    t_struct::append((t_struct *)local_150,this_01);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_268);
  }
  client_class_name_abi_cxx11_(&local_2c8,this);
  std::__cxx11::string::string((string *)&local_328,(string *)local_38);
  t_generator::capitalize(&local_308,(t_generator *)this,&local_328);
  std::operator+(&local_2e8,"recv",&local_308);
  st_method(this,(ostream *)&this->f_,&local_2c8,&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::~string((string *)&local_2c8);
  poVar5 = std::operator<<((ostream *)&this->f_,"| f msg res | ");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_348,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_348);
  poVar5 = std::operator<<(poVar5,"msg := oprot readMessageBegin.");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_368,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_368);
  poVar5 = std::operator<<(poVar5,"self validateRemoteMessage: msg.");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_388,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_388);
  poVar5 = std::operator<<(poVar5,"res := ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3c8,"",&local_3c9);
  struct_reader(&local_3a8,this,(t_struct *)local_150,&local_3c8);
  poVar5 = std::operator<<(poVar5,(string *)&local_3a8);
  poVar5 = std::operator<<(poVar5,".");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_3f0,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_3f0);
  poVar5 = std::operator<<(poVar5,"oprot readMessageEnd.");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_410,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_410);
  poVar5 = std::operator<<(poVar5,"oprot transport flush.");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_430,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_430);
  poVar5 = std::operator<<(poVar5,"res exception ifNotNil: [res exception signal].");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_450,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_450);
  std::operator<<(poVar5,"^ res");
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&local_348);
  st_close_method(this,(ostream *)&this->f_);
  t_field::~t_field((t_field *)local_228);
  t_struct::~t_struct((t_struct *)local_150);
  std::__cxx11::string::~string((string *)&result.xsd_all_);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void t_st_generator::generate_recv_method(t_function* function) {
  string funname = camelcase(function->get_name());
  string signature = function_signature(function);

  t_struct result(program_, "TResult");
  t_field success(function->get_returntype(), "success", 0);
  result.append(&success);

  t_struct* xs = function->get_xceptions();
  const vector<t_field*>& fields = xs->get_members();
  vector<t_field*>::const_iterator f_iter;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    // duplicate the field, but call it "exception"... we don't need a dynamic name
    t_field* exception = new t_field((*f_iter)->get_type(), "exception", (*f_iter)->get_key());
    result.append(exception);
  }

  st_method(f_, client_class_name(), "recv" + capitalize(funname));
  f_ << "| f msg res | " << endl << indent() << "msg := oprot readMessageBegin." << endl << indent()
     << "self validateRemoteMessage: msg." << endl << indent()
     << "res := " << struct_reader(&result) << "." << endl << indent() << "oprot readMessageEnd."
     << endl << indent() << "oprot transport flush." << endl << indent()
     << "res exception ifNotNil: [res exception signal]." << endl << indent() << "^ res";
  st_close_method(f_);
}